

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
LiteScript::Instruction::LoadBinary
          (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
           *__return_storage_ptr__,istream *stream)

{
  char cVar1;
  ulong __n;
  uint uVar2;
  Instruction instr;
  uint sz;
  IStreamer streamer;
  string s_tmp;
  value_type local_70;
  uint local_5c;
  IStreamer local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_58.stream = stream;
  IStreamer::operator>>(&local_58,&local_5c);
  if (local_5c != 0) {
    uVar2 = 0;
    do {
      local_70.code = std::istream::get();
      local_70.comp_type = std::istream::get();
      switch(local_70.comp_type) {
      case '\x01':
        std::istream::_M_extract<bool>((bool *)stream);
        break;
      case '\x02':
        IStreamer::operator>>(&local_58,&local_70.comp_value.v_integer);
        break;
      case '\x03':
        IStreamer::operator>>(&local_58,&local_70.comp_value.v_float);
        break;
      case '\x04':
        local_48 = 0;
        *local_50 = 0;
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (cVar1 = std::istream::get(), cVar1 != '\0'))) {
          std::__cxx11::string::push_back((char)&local_50);
        }
        __n = local_48 + 1;
        local_70.comp_value.v_string = (char *)operator_new__(__n);
        memcpy(local_70.comp_value.v_string,local_50,__n);
        break;
      default:
        local_70.comp_type = '\0';
      }
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (__return_storage_ptr__,&local_70);
      if (local_70.comp_type == '\x04') {
        operator_delete(local_70.comp_value.v_string);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_5c);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LiteScript::Instruction> LiteScript::Instruction::LoadBinary(std::istream &stream) {
    std::vector<Instruction> res;
    IStreamer streamer(stream);
    std::string s_tmp;
    unsigned char c_tmp;
    unsigned int sz;
    streamer >> sz;
    for (unsigned int i = 0; i < sz; i++) {
        Instruction instr;
        streamer >> instr.code;
        streamer >> instr.comp_type;
        switch (instr.comp_type) {
            case CompType::COMP_TYPE_BOOLEAN:
                stream >> instr.comp_value.v_boolean;
                break;
            case CompType::COMP_TYPE_INTEGER:
                streamer >> instr.comp_value.v_integer;
                break;
            case CompType::COMP_TYPE_FLOAT:
                streamer >> instr.comp_value.v_float;
                break;
            case CompType::COMP_TYPE_STRING:
                s_tmp.clear();
                while (!stream.eof() && (c_tmp = (unsigned char)stream.get()) != 0)
                    s_tmp += c_tmp;
                instr.comp_value.v_string = new char[s_tmp.size() + 1];
                memcpy(instr.comp_value.v_string, s_tmp.c_str(), s_tmp.size() + 1);
                break;
            default:
                instr.comp_type = 0;
        }
        res.push_back(instr);
    }
    return res;
}